

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

void __thiscall File::File(File *this)

{
  File *this_local;
  
  this->fp = (void *)0x0;
  return;
}

Assistant:

File::File()
{
#ifdef _WIN32
  ASSERT(sizeof(fp) >= sizeof(HANDLE));
  fp = INVALID_HANDLE_VALUE;
#else
  fp = 0;
#endif
}